

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void baller_initiate(Curl_cfilter *cf,Curl_easy *data,eyeballer *baller)

{
  CURLcode CVar1;
  Curl_addrinfo *pCVar2;
  eyeballer *peStack_38;
  CURLcode result;
  Curl_cfilter *wcf;
  Curl_cfilter *cf_prev;
  cf_he_ctx *ctx;
  eyeballer *baller_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  cf_prev = (Curl_cfilter *)cf->ctx;
  wcf = baller->cf;
  ctx = (cf_he_ctx *)baller;
  baller_local = (eyeballer *)data;
  data_local = (Curl_easy *)cf;
  CVar1 = (*baller->cf_create)(&baller->cf,data,cf->conn,baller->addr,*(int *)&cf_prev->cft);
  if (CVar1 == CURLE_OK) {
    for (peStack_38 = ctx->baller[1]; peStack_38 != (eyeballer *)0x0;
        peStack_38 = (eyeballer *)peStack_38->first) {
      *(connectdata **)&peStack_38->ai_family = data_local->conn;
      *(undefined4 *)&peStack_38->cf_create = *(undefined4 *)&(data_local->multi_queue)._list;
    }
    pCVar2 = addr_next_match((Curl_addrinfo *)ctx->remotehost,ctx->state);
    if (pCVar2 != (Curl_addrinfo *)0x0) {
      Curl_expire((Curl_easy *)baller_local,(timediff_t)ctx[1].cf_create,
                  *(expire_id *)&ctx[1].remotehost);
    }
  }
  if (CVar1 != CURLE_OK) {
    if ((((baller_local != (eyeballer *)0x0) &&
         ((*(ulong *)((long)&baller_local[0x1a].first + 2) >> 0x1c & 1) != 0)) &&
        ((baller_local[0x2f].addr == (Curl_addrinfo *)0x0 ||
         (0 < (baller_local[0x2f].addr)->ai_socktype)))) &&
       ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
      Curl_trc_cf_infof((Curl_easy *)baller_local,(Curl_cfilter *)data_local,"%s failed",
                        *(undefined8 *)ctx);
    }
    baller_close((eyeballer *)ctx,(Curl_easy *)baller_local);
  }
  if (wcf != (Curl_cfilter *)0x0) {
    Curl_conn_cf_discard_chain(&wcf,(Curl_easy *)baller_local);
  }
  *(CURLcode *)((long)&ctx[1].remotehost + 4) = CVar1;
  return;
}

Assistant:

static void baller_initiate(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            struct eyeballer *baller)
{
  struct cf_he_ctx *ctx = cf->ctx;
  struct Curl_cfilter *cf_prev = baller->cf;
  struct Curl_cfilter *wcf;
  CURLcode result;


  /* Do not close a previous cfilter yet to ensure that the next IP's
     socket gets a different file descriptor, which can prevent bugs when
     the curl_multi_socket_action interface is used with certain select()
     replacements such as kqueue. */
  result = baller->cf_create(&baller->cf, data, cf->conn, baller->addr,
                             ctx->transport);
  if(result)
    goto out;

  /* the new filter might have sub-filters */
  for(wcf = baller->cf; wcf; wcf = wcf->next) {
    wcf->conn = cf->conn;
    wcf->sockindex = cf->sockindex;
  }

  if(addr_next_match(baller->addr, baller->ai_family)) {
    Curl_expire(data, baller->timeoutms, baller->timeout_id);
  }

out:
  if(result) {
    CURL_TRC_CF(data, cf, "%s failed", baller->name);
    baller_close(baller, data);
  }
  if(cf_prev)
    Curl_conn_cf_discard_chain(&cf_prev, data);
  baller->result = result;
}